

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

_Bool run_bitset_container_intersect(run_container_t *src_1,bitset_container_t *src_2)

{
  _Bool _Var1;
  bitset_container_t *in_RSI;
  run_container_t *in_RDI;
  rle16_t rle;
  int32_t rlepos;
  int local_1c;
  _Bool local_1;
  
  _Var1 = run_container_is_full(in_RDI);
  if (_Var1) {
    _Var1 = bitset_container_empty(in_RSI);
    local_1 = (_Bool)((_Var1 ^ 0xffU) & 1);
  }
  else {
    for (local_1c = 0; local_1c < in_RDI->n_runs; local_1c = local_1c + 1) {
      _Var1 = bitset_lenrange_empty
                        (in_RSI->words,(uint)in_RDI->runs[local_1c] & 0xffff,
                         (uint)in_RDI->runs[local_1c] >> 0x10);
      if (!_Var1) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool run_bitset_container_intersect(const run_container_t *src_1,
                                    const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return !bitset_container_empty(src_2);
    }
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        if (!bitset_lenrange_empty(src_2->words, rle.value, rle.length))
            return true;
    }
    return false;
}